

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixLockSharedMemory(unixFile *pDbFd,unixShmNode *pShmNode)

{
  int iVar1;
  int local_3c;
  short local_38 [2];
  int rc;
  flock lock;
  unixShmNode *pShmNode_local;
  unixFile *pDbFd_local;
  
  local_3c = 0;
  local_38[1] = 0;
  lock.l_type = 0x80;
  lock.l_whence = 0;
  lock._4_4_ = 0;
  lock.l_start = 1;
  local_38[0] = 1;
  lock._24_8_ = pShmNode;
  iVar1 = (*aSyscall[7].pCurrent)((ulong)(uint)pShmNode->hShm,5,local_38);
  if (iVar1 == 0) {
    if (local_38[0] == 2) {
      if (*(char *)(lock._24_8_ + 0x22) == '\0') {
        local_3c = unixShmSystemLock(pDbFd,1,0x80,1);
        if ((local_3c == 0) &&
           (iVar1 = robust_ftruncate(*(int *)(lock._24_8_ + 0x18),3), iVar1 != 0)) {
          local_3c = unixLogErrorAtLine(0x120a,"ftruncate",*(char **)(lock._24_8_ + 0x10),0x905a);
        }
      }
      else {
        *(undefined1 *)(lock._24_8_ + 0x23) = 1;
        local_3c = 0x508;
      }
    }
    else if (local_38[0] == 1) {
      local_3c = 5;
    }
  }
  else {
    local_3c = 0xf0a;
  }
  if (local_3c == 0) {
    local_3c = unixShmSystemLock(pDbFd,0,0x80,1);
  }
  return local_3c;
}

Assistant:

static int unixLockSharedMemory(unixFile *pDbFd, unixShmNode *pShmNode){
  struct flock lock;
  int rc = SQLITE_OK;

  /* Use F_GETLK to determine the locks other processes are holding
  ** on the DMS byte. If it indicates that another process is holding
  ** a SHARED lock, then this process may also take a SHARED lock
  ** and proceed with opening the *-shm file. 
  **
  ** Or, if no other process is holding any lock, then this process
  ** is the first to open it. In this case take an EXCLUSIVE lock on the
  ** DMS byte and truncate the *-shm file to zero bytes in size. Then
  ** downgrade to a SHARED lock on the DMS byte.
  **
  ** If another process is holding an EXCLUSIVE lock on the DMS byte,
  ** return SQLITE_BUSY to the caller (it will try again). An earlier
  ** version of this code attempted the SHARED lock at this point. But
  ** this introduced a subtle race condition: if the process holding
  ** EXCLUSIVE failed just before truncating the *-shm file, then this
  ** process might open and use the *-shm file without truncating it.
  ** And if the *-shm file has been corrupted by a power failure or
  ** system crash, the database itself may also become corrupt.  */
  lock.l_whence = SEEK_SET;
  lock.l_start = UNIX_SHM_DMS;
  lock.l_len = 1;
  lock.l_type = F_WRLCK;
  if( osFcntl(pShmNode->hShm, F_GETLK, &lock)!=0 ) {
    rc = SQLITE_IOERR_LOCK;
  }else if( lock.l_type==F_UNLCK ){
    if( pShmNode->isReadonly ){
      pShmNode->isUnlocked = 1;
      rc = SQLITE_READONLY_CANTINIT;
    }else{
      rc = unixShmSystemLock(pDbFd, F_WRLCK, UNIX_SHM_DMS, 1);
      /* The first connection to attach must truncate the -shm file.  We
      ** truncate to 3 bytes (an arbitrary small number, less than the
      ** -shm header size) rather than 0 as a system debugging aid, to
      ** help detect if a -shm file truncation is legitimate or is the work
      ** or a rogue process. */
      if( rc==SQLITE_OK && robust_ftruncate(pShmNode->hShm, 3) ){
        rc = unixLogError(SQLITE_IOERR_SHMOPEN,"ftruncate",pShmNode->zFilename);
      }
    }
  }else if( lock.l_type==F_WRLCK ){
    rc = SQLITE_BUSY;
  }

  if( rc==SQLITE_OK ){
    assert( lock.l_type==F_UNLCK || lock.l_type==F_RDLCK );
    rc = unixShmSystemLock(pDbFd, F_RDLCK, UNIX_SHM_DMS, 1);
  }
  return rc;
}